

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
cnpy::operator+=(vector<char,_std::allocator<char>_> *lhs,char *rhs)

{
  value_type *__x;
  vector<char,_std::allocator<char>_> *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t byte;
  size_t len;
  value_type *local_20;
  
  __x = (value_type *)strlen((char *)in_RSI);
  std::vector<char,_std::allocator<char>_>::reserve((vector<char,_std::allocator<char>_> *)len,byte)
  ;
  for (local_20 = (value_type *)0x0; local_20 < __x; local_20 = local_20 + 1) {
    std::vector<char,_std::allocator<char>_>::push_back(in_RSI,__x);
  }
  return in_RDI;
}

Assistant:

std::vector<char>& cnpy::operator+=(std::vector<char>& lhs, const char* rhs) {
    //write in little endian
    size_t len = strlen(rhs);
    lhs.reserve(len);
    for(size_t byte = 0; byte < len; byte++) {
        lhs.push_back(rhs[byte]);
    }
    return lhs;
}